

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

long ov_serialnumber(OggVorbis_File *vf,int i)

{
  int i_local;
  OggVorbis_File *vf_local;
  
  if (i < vf->links) {
    if ((vf->seekable == 0) && (-1 < i)) {
      vf_local = (OggVorbis_File *)ov_serialnumber(vf,-1);
    }
    else if (i < 0) {
      vf_local = (OggVorbis_File *)vf->current_serialno;
    }
    else {
      vf_local = (OggVorbis_File *)vf->serialnos[i];
    }
  }
  else {
    vf_local = (OggVorbis_File *)ov_serialnumber(vf,vf->links + -1);
  }
  return (long)vf_local;
}

Assistant:

long ov_serialnumber(OggVorbis_File *vf,int i){
  if(i>=vf->links)return(ov_serialnumber(vf,vf->links-1));
  if(!vf->seekable && i>=0)return(ov_serialnumber(vf,-1));
  if(i<0){
    return(vf->current_serialno);
  }else{
    return(vf->serialnos[i]);
  }
}